

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSizeAllocationsManager.hpp
# Opt level: O2

void __thiscall
Diligent::VariableSizeAllocationsManager::Free
          (VariableSizeAllocationsManager *this,OffsetType Offset,OffsetType Size)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  iterator __position;
  iterator iVar3;
  const_iterator __position_00;
  const_iterator __last;
  char (*in_RCX) [81];
  OffsetType Size_00;
  OffsetType OVar4;
  string msg;
  OffsetType local_68;
  string local_60;
  OffsetType local_40;
  OffsetType local_38;
  
  local_68 = Offset;
  if ((Offset == 0xffffffffffffffff) || (this->m_MaxSize < Offset + Size)) {
    FormatString<char[26],char[66]>
              (&local_60,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Offset != Allocation::InvalidOffset && Offset + Size <= m_MaxSize",
               (char (*) [66])in_RCX);
    in_RCX = (char (*) [81])0x118;
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"Free",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x118);
    std::__cxx11::string::~string((string *)&local_60);
  }
  __position = std::
               _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_std::_Select1st<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
               ::upper_bound((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_std::_Select1st<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
                              *)this,&local_68);
  iVar3 = std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_std::_Select1st<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
          ::lower_bound((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_std::_Select1st<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
                         *)this,&local_68);
  if (iVar3._M_node != __position._M_node) {
    FormatString<char[26],char[22]>
              (&local_60,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"LowBnd == NextBlockIt",(char (*) [22])in_RCX);
    in_RCX = (char (*) [81])0x122;
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"Free",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x122);
    std::__cxx11::string::~string((string *)&local_60);
  }
  p_Var1 = &(this->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header;
  if (((_Rb_tree_header *)__position._M_node != p_Var1) &&
     (*(ulong *)(__position._M_node + 1) < local_68 + Size)) {
    FormatString<char[26],char[81]>
              (&local_60,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])
               "NextBlockIt == m_FreeBlocksByOffset.end() || Offset + Size <= NextBlockIt->first",
               in_RCX);
    in_RCX = (char (*) [81])0x126;
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"Free",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x126);
    std::__cxx11::string::~string((string *)&local_60);
  }
  OVar4 = local_68;
  if (__position._M_node !=
      (this->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header._M_header._M_left) {
    local_40 = Size;
    __position_00._M_node = (_Base_ptr)std::_Rb_tree_decrement(__position._M_node);
    if (OVar4 < (ulong)((long)&(__position_00._M_node[1]._M_parent)->_M_color +
                       *(long *)(__position_00._M_node + 1))) {
      FormatString<char[26],char[56]>
                (&local_60,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"Offset >= PrevBlockIt->first + PrevBlockIt->second.Size",
                 (char (*) [56])in_RCX);
      in_RCX = (char (*) [81])0x12c;
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"Free",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,300);
      std::__cxx11::string::~string((string *)&local_60);
      OVar4 = local_68;
    }
    Size = local_40;
    if ((_Rb_tree_header *)__position_00._M_node != p_Var1) {
      local_38 = *(OffsetType *)(__position_00._M_node + 1);
      if (OVar4 == (long)&(__position_00._M_node[1]._M_parent)->_M_color + local_38) {
        Size_00 = (long)&(__position_00._M_node[1]._M_parent)->_M_color + local_40;
        if (((_Rb_tree_header *)__position._M_node == p_Var1) ||
           (OVar4 + local_40 != *(long *)(__position._M_node + 1))) {
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,std::_Select1st<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,Diligent::IMemoryAllocator>>
          ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,std::_Select1st<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,Diligent::IMemoryAllocator>>
                              *)&this->m_FreeBlocksBySize,__position_00._M_node[1]._M_left);
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,std::_Select1st<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,Diligent::IMemoryAllocator>>
          ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,std::_Select1st<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,Diligent::IMemoryAllocator>>
                              *)this,(iterator)__position_00._M_node);
          OVar4 = local_38;
        }
        else {
          p_Var2 = __position._M_node[1]._M_parent;
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,std::_Select1st<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,Diligent::IMemoryAllocator>>
          ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,std::_Select1st<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,Diligent::IMemoryAllocator>>
                              *)&this->m_FreeBlocksBySize,__position_00._M_node[1]._M_left);
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,std::_Select1st<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,Diligent::IMemoryAllocator>>
          ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,std::_Select1st<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,Diligent::IMemoryAllocator>>
                              *)&this->m_FreeBlocksBySize,__position._M_node[1]._M_left);
          __last._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
          std::
          _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_std::_Select1st<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
          ::_M_erase_aux((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_std::_Select1st<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>_>,_std::less<unsigned_long>,_Diligent::STDAllocator<std::pair<const_unsigned_long,_Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,_Diligent::IMemoryAllocator>_>
                          *)this,__position_00,__last);
          Size_00 = (long)&p_Var2->_M_color + Size_00;
          OVar4 = local_38;
        }
        goto LAB_00247b20;
      }
    }
  }
  Size_00 = Size;
  if (((_Rb_tree_header *)__position._M_node != p_Var1) &&
     (OVar4 + Size == *(long *)(__position._M_node + 1))) {
    p_Var2 = __position._M_node[1]._M_parent;
    std::
    _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,std::_Select1st<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,Diligent::IMemoryAllocator>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,std::_Select1st<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,std::_Rb_tree_iterator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>>,Diligent::IMemoryAllocator>>
                        *)&this->m_FreeBlocksBySize,__position._M_node[1]._M_left);
    std::
    _Rb_tree<unsigned_long,std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,std::_Select1st<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,Diligent::IMemoryAllocator>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,std::_Select1st<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>>,std::less<unsigned_long>,Diligent::STDAllocator<std::pair<unsigned_long_const,Diligent::VariableSizeAllocationsManager::FreeBlockInfo>,Diligent::IMemoryAllocator>>
                        *)this,__position);
    Size_00 = (long)&p_Var2->_M_color + Size;
  }
LAB_00247b20:
  AddNewBlock(this,OVar4,Size_00);
  OVar4 = Size + this->m_FreeSize;
  this->m_FreeSize = OVar4;
  if (OVar4 == this->m_MaxSize) {
    if ((this->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header._M_node_count != 1) {
      FormatString<char[26],char[24]>
                (&local_60,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"GetNumFreeBlocks() == 1",(char (*) [24])in_RCX);
      in_RCX = (char (*) [81])0x16d;
      DebugAssertionFailed
                (local_60._M_dataplus._M_p,"Free",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
                 ,0x16d);
      std::__cxx11::string::~string((string *)&local_60);
    }
    ResetCurrAlignment(this);
  }
  if ((this->m_FreeBlocksByOffset)._M_t._M_impl.super__Rb_tree_header._M_node_count !=
      (this->m_FreeBlocksBySize)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    FormatString<char[26],char[57]>
              (&local_60,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_FreeBlocksByOffset.size() == m_FreeBlocksBySize.size()",
               (char (*) [57])in_RCX);
    DebugAssertionFailed
              (local_60._M_dataplus._M_p,"Free",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/VariableSizeAllocationsManager.hpp"
               ,0x172);
    std::__cxx11::string::~string((string *)&local_60);
  }
  if (this->m_DbgDisableDebugValidation == false) {
    DbgVerifyList(this);
  }
  return;
}

Assistant:

void Free(OffsetType Offset, OffsetType Size)
    {
        VERIFY_EXPR(Offset != Allocation::InvalidOffset && Offset + Size <= m_MaxSize);

        // Find the first element whose offset is greater than the specified offset.
        // upper_bound() returns an iterator pointing to the first element in the
        // container whose key is considered to go after k.
        auto NextBlockIt = m_FreeBlocksByOffset.upper_bound(Offset);
#ifdef DILIGENT_DEBUG
        {
            auto LowBnd = m_FreeBlocksByOffset.lower_bound(Offset); // First element whose offset is  >=
            // Since zero-size allocations are not allowed, lower bound must always be equal to the upper bound
            VERIFY_EXPR(LowBnd == NextBlockIt);
        }
#endif
        // Block being deallocated must not overlap with the next block
        VERIFY_EXPR(NextBlockIt == m_FreeBlocksByOffset.end() || Offset + Size <= NextBlockIt->first);
        auto PrevBlockIt = NextBlockIt;
        if (PrevBlockIt != m_FreeBlocksByOffset.begin())
        {
            --PrevBlockIt;
            // Block being deallocated must not overlap with the previous block
            VERIFY_EXPR(Offset >= PrevBlockIt->first + PrevBlockIt->second.Size);
        }
        else
            PrevBlockIt = m_FreeBlocksByOffset.end();

        OffsetType NewSize, NewOffset;
        if (PrevBlockIt != m_FreeBlocksByOffset.end() && Offset == PrevBlockIt->first + PrevBlockIt->second.Size)
        {
            //  PrevBlock.Offset             Offset
            //       |                          |
            //       |<-----PrevBlock.Size----->|<------Size-------->|
            //
            NewSize   = PrevBlockIt->second.Size + Size;
            NewOffset = PrevBlockIt->first;

            if (NextBlockIt != m_FreeBlocksByOffset.end() && Offset + Size == NextBlockIt->first)
            {
                //   PrevBlock.Offset           Offset            NextBlock.Offset
                //     |                          |                    |
                //     |<-----PrevBlock.Size----->|<------Size-------->|<-----NextBlock.Size----->|
                //
                NewSize += NextBlockIt->second.Size;
                m_FreeBlocksBySize.erase(PrevBlockIt->second.OrderBySizeIt);
                m_FreeBlocksBySize.erase(NextBlockIt->second.OrderBySizeIt);
                // Delete the range of two blocks
                ++NextBlockIt;
                m_FreeBlocksByOffset.erase(PrevBlockIt, NextBlockIt);
            }
            else
            {
                //   PrevBlock.Offset           Offset                     NextBlock.Offset
                //     |                          |                             |
                //     |<-----PrevBlock.Size----->|<------Size-------->| ~ ~ ~  |<-----NextBlock.Size----->|
                //
                m_FreeBlocksBySize.erase(PrevBlockIt->second.OrderBySizeIt);
                m_FreeBlocksByOffset.erase(PrevBlockIt);
            }
        }
        else if (NextBlockIt != m_FreeBlocksByOffset.end() && Offset + Size == NextBlockIt->first)
        {
            //   PrevBlock.Offset                   Offset            NextBlock.Offset
            //     |                                  |                    |
            //     |<-----PrevBlock.Size----->| ~ ~ ~ |<------Size-------->|<-----NextBlock.Size----->|
            //
            NewSize   = Size + NextBlockIt->second.Size;
            NewOffset = Offset;
            m_FreeBlocksBySize.erase(NextBlockIt->second.OrderBySizeIt);
            m_FreeBlocksByOffset.erase(NextBlockIt);
        }
        else
        {
            //   PrevBlock.Offset                   Offset                     NextBlock.Offset
            //     |                                  |                            |
            //     |<-----PrevBlock.Size----->| ~ ~ ~ |<------Size-------->| ~ ~ ~ |<-----NextBlock.Size----->|
            //
            NewSize   = Size;
            NewOffset = Offset;
        }

        AddNewBlock(NewOffset, NewSize);

        m_FreeSize += Size;
        if (IsEmpty())
        {
            // Reset current alignment
            VERIFY_EXPR(GetNumFreeBlocks() == 1);
            ResetCurrAlignment();
        }

#ifdef DILIGENT_DEBUG
        VERIFY_EXPR(m_FreeBlocksByOffset.size() == m_FreeBlocksBySize.size());
        if (!m_DbgDisableDebugValidation)
            DbgVerifyList();
#endif
    }